

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O1

sysbvm_tuple_t sysbvm_integer_normalize(sysbvm_context_t *context,sysbvm_integer_t *integer)

{
  bool bVar1;
  sysbvm_integer_t *psVar2;
  sysbvm_tuple_t type;
  ulong uVar3;
  sysbvm_object_tuple_t *psVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  uVar5 = (ulong)integer & 0xf;
  if (uVar5 != 0 || integer == (sysbvm_integer_t *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)((integer->header).objectSize >> 2);
  }
  uVar7 = uVar3 + 1;
  do {
    lVar6 = uVar7;
    if (lVar6 == 1) {
      uVar7 = 0;
      break;
    }
    uVar7 = lVar6 + -1;
  } while (integer->words[lVar6 + -2] != 0);
  psVar2 = (sysbvm_integer_t *)0x1;
  if (uVar7 == uVar3) {
    psVar2 = integer;
  }
  if (uVar7 == uVar3 || lVar6 == 1) {
    return (sysbvm_tuple_t)psVar2;
  }
  if (uVar5 != 0 || integer == (sysbvm_integer_t *)0x0) {
    if ((int)uVar5 == 0xf) {
      type = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)integer >> 4);
    }
    else {
      type = sysbvm_tuple_getImmediateTypeWithTag(context,uVar5);
    }
  }
  else {
    type = (integer->header).field_0.typePointer;
  }
  if (2 < uVar7) goto LAB_00114991;
  uVar5 = *(ulong *)integer->words;
  uVar3 = (ulong)*(uint *)&integer->field_0x14;
  if (type == (context->roots).largeNegativeIntegerType) {
    uVar3 = 0x800000000000000;
    if (uVar5 < 0x800000000000001) {
      uVar3 = uVar5 * -0x10 + 1;
      bVar1 = false;
    }
    else {
LAB_0011498b:
      bVar1 = true;
    }
  }
  else {
    if (0x7ffffff < *(uint *)&integer->field_0x14) goto LAB_0011498b;
    uVar3 = uVar5 * 0x10 + 1;
    bVar1 = false;
  }
  if (!bVar1) {
    return uVar3;
  }
LAB_00114991:
  psVar4 = sysbvm_context_allocateByteTuple(context,type,uVar7 * 4);
  memcpy(&psVar4->field_1,integer->words,uVar7 * 4);
  return uVar7;
}

Assistant:

static sysbvm_tuple_t sysbvm_integer_normalize(sysbvm_context_t *context, sysbvm_integer_t *integer)
{
    // Counte the required number of normalized words.
    size_t wordCount = sysbvm_tuple_getSizeInBytes((sysbvm_tuple_t)integer) / 4;
    size_t normalizedWordCount = wordCount;
    while(normalizedWordCount > 0 && integer->words[normalizedWordCount - 1])
        --normalizedWordCount;

    // Trivial cases.
    if(normalizedWordCount == wordCount)
    {
        return (sysbvm_tuple_t)integer;
    }
    else if(normalizedWordCount == 0)
    {
        return sysbvm_tuple_integer_encodeSmall(0);
    }
    
    // Attempt to fit in an immediate, if possible.
    sysbvm_tuple_t largeIntegerType = sysbvm_tuple_getType(context, (sysbvm_tuple_t)integer);
    bool isNegative = largeIntegerType == context->roots.largeNegativeIntegerType;
    if(normalizedWordCount <= 2)
    {
        uint64_t valueUInt64 = (uint64_t)integer->words[0] | ((uint64_t)integer->words[1] << 32);
        if(isNegative)
        {
            if(valueUInt64 <= (uint64_t)-SYSBVM_IMMEDIATE_INT_MIN)
                return (sysbvm_tuple_t)sysbvm_tuple_integer_encodeSmall(-(sysbvm_stuple_t)valueUInt64);
        }
        else
        {
            if(valueUInt64 <= SYSBVM_IMMEDIATE_INT_MAX)
                return (sysbvm_tuple_t)sysbvm_tuple_integer_encodeSmall((sysbvm_stuple_t)valueUInt64);
        }
    }

    // Make a newer smaller large integer.
    sysbvm_integer_t *normalizedResult = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, largeIntegerType, normalizedWordCount*4);
    memcpy(normalizedResult->words, integer->words, 4*normalizedWordCount);
    return (sysbvm_tuple_t)normalizedWordCount;
}